

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O3

void __thiscall
duckdb::RadixPartitionedTupleData::ComputePartitionIndices
          (RadixPartitionedTupleData *this,Vector *row_locations,idx_t count,
          Vector *partition_indices,
          unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *utility_vector)

{
  _Head_base<0UL,_duckdb::Vector_*,_false> __ptr;
  column_t column_id;
  idx_t radix_bits;
  _Head_base<0UL,_duckdb::Vector_*,_false> this_00;
  type result;
  pointer this_01;
  SelectionVector *pSVar1;
  SelectionVector *target_sel;
  idx_t count_local;
  LogicalType local_48;
  
  count_local = count;
  if ((utility_vector->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl == (Vector *)0x0) {
    this_00._M_head_impl = (Vector *)operator_new(0x68);
    LogicalType::LogicalType(&local_48,UBIGINT);
    Vector::Vector(this_00._M_head_impl,&local_48,0x800);
    LogicalType::~LogicalType(&local_48);
    __ptr._M_head_impl =
         (utility_vector->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
         super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
    (utility_vector->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = this_00._M_head_impl;
    if (__ptr._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)utility_vector,__ptr._M_head_impl);
    }
  }
  result = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     (utility_vector);
  this_01 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator->((this->super_PartitionedTupleData).partitions.
                         super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  pSVar1 = FlatVector::IncrementalSelectionVector();
  column_id = this->hash_col_idx;
  target_sel = FlatVector::IncrementalSelectionVector();
  TupleDataCollection::Gather
            (this_01,row_locations,pSVar1,count,column_id,result,target_sel,
             (optional_ptr<duckdb::Vector,_true>)0x0);
  radix_bits = this->radix_bits;
  pSVar1 = FlatVector::IncrementalSelectionVector();
  RadixBitsSwitch<duckdb::ComputePartitionIndicesFunctor,void,duckdb::Vector&,duckdb::Vector&,unsigned_long&,duckdb::SelectionVector_const&,unsigned_long&>
            (radix_bits,result,partition_indices,&count_local,pSVar1,&count_local);
  return;
}

Assistant:

void RadixPartitionedTupleData::ComputePartitionIndices(Vector &row_locations, idx_t count, Vector &partition_indices,
                                                        unique_ptr<Vector> &utility_vector) const {
	if (!utility_vector) {
		utility_vector = make_uniq<Vector>(LogicalType::HASH);
	}
	Vector &intermediate = *utility_vector;
	partitions[0]->Gather(row_locations, *FlatVector::IncrementalSelectionVector(), count, hash_col_idx, intermediate,
	                      *FlatVector::IncrementalSelectionVector(), nullptr);
	RadixBitsSwitch<ComputePartitionIndicesFunctor, void>(radix_bits, intermediate, partition_indices, count,
	                                                      *FlatVector::IncrementalSelectionVector(), count);
}